

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O3

int LowMC_test_vector_129_129_4_2(void)

{
  int iVar1;
  uint8_t ciphertext_expected [17];
  uint8_t plaintext [17];
  uint8_t key [17];
  uint8_t local_58 [32];
  uint8_t local_38 [32];
  uint8_t local_18 [24];
  
  local_18[0x10] = 0x80;
  local_38[0x10] = 0;
  local_58[0x10] = 0x80;
  local_18[0] = 0xab;
  local_18[1] = '\"';
  local_18[2] = 'B';
  local_18[3] = 'Q';
  local_18[4] = 'I';
  local_18[5] = 0xaa;
  local_18[6] = 'a';
  local_18[7] = '-';
  local_18[8] = '\x7f';
  local_18[9] = 0xff;
  local_18[10] = '\x13';
  local_18[0xb] = 'r';
  local_18[0xc] = ' ';
  local_18[0xd] = '\'';
  local_18[0xe] = '[';
  local_18[0xf] = '\x16';
  local_38[0] = 'K';
  local_38[1] = 0x99;
  local_38[2] = '#';
  local_38[3] = 'S';
  local_38[4] = 0xa6;
  local_38[5] = '\x06';
  local_38[6] = 'e';
  local_38[7] = 0xbf;
  local_38[8] = 0x99;
  local_38[9] = '-';
  local_38[10] = '\x03';
  local_38[0xb] = 'T';
  local_38[0xc] = 0x82;
  local_38[0xd] = 0xc1;
  local_38[0xe] = 0xd2;
  local_38[0xf] = 'y';
  local_58[0] = '*';
  local_58[1] = '@';
  local_58[2] = 'b';
  local_58[3] = 0xd8;
  local_58[4] = '5';
  local_58[5] = 0xc5;
  local_58[6] = 0x93;
  local_58[7] = 0xea;
  local_58[8] = '\x19';
  local_58[9] = 0xf8;
  local_58[10] = '\"';
  local_58[0xb] = 0xad;
  local_58[0xc] = '$';
  local_58[0xd] = '$';
  local_58[0xe] = 'w';
  local_58[0xf] = 0xd2;
  iVar1 = lowmc_enc(&parameters_129_129_4,local_18,local_38,local_58);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_129_129_4_2(void) {
  const uint8_t key[17] = {
      0xab, 0x22, 0x42, 0x51, 0x49, 0xaa, 0x61, 0x2d, 0x7f,
      0xff, 0x13, 0x72, 0x20, 0x27, 0x5b, 0x16, 0x80,
  };
  const uint8_t plaintext[17] = {
      0x4b, 0x99, 0x23, 0x53, 0xa6, 0x6,  0x65, 0xbf, 0x99,
      0x2d, 0x3,  0x54, 0x82, 0xc1, 0xd2, 0x79, 0x0,
  };
  const uint8_t ciphertext_expected[17] = {
      0x2a, 0x40, 0x62, 0xd8, 0x35, 0xc5, 0x93, 0xea, 0x19,
      0xf8, 0x22, 0xad, 0x24, 0x24, 0x77, 0xd2, 0x80,
  };

  return lowmc_enc(&parameters_129_129_4, key, plaintext, ciphertext_expected);
}